

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

bool __thiscall Debugger::Initialize(Debugger *this)

{
  undefined4 uVar1;
  bool bVar2;
  JsErrorCode JVar3;
  PAL_FILE *pPVar4;
  LPCWSTR pWVar5;
  JsValueRef pvStack_b8;
  JsErrorCode jsErrorCode_8;
  JsPropertyIdRef hostDebugObject;
  JsPropertyIdRef pvStack_a8;
  JsErrorCode jsErrorCode_7;
  JsPropertyIdRef hostDebugObjectPropId;
  JsValueRef pvStack_98;
  JsErrorCode jsErrorCode_6;
  JsValueRef globalObj;
  JsValueRef pvStack_88;
  JsErrorCode jsErrorCode_5;
  JsValueRef result;
  JsValueRef args [1];
  JsValueRef pvStack_70;
  JsErrorCode jsErrorCode_4;
  JsValueRef undefinedValue;
  JsValueRef pvStack_60;
  JsErrorCode jsErrorCode_3;
  JsValueRef fname;
  JsErrorCode local_44;
  JsValueRef pvStack_40;
  JsErrorCode jsErrorCode_2;
  JsValueRef scriptSource;
  JsValueRef globalFunc;
  AutoRestoreContext autoRestoreContext;
  JsErrorCode jsErrorCode_1;
  JsErrorCode jsErrorCode;
  Debugger *this_local;
  
  if (this->m_context != (JsContextRef)0x0) {
    pPVar4 = PAL_get_stderr(0);
    PAL_fprintf(pPVar4,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Debugger.cpp"
                ,0xe9,"this->m_context == JS_INVALID_REFERENCE");
    pPVar4 = PAL_get_stderr(0);
    PAL_fflush(pPVar4);
    DebugBreak();
  }
  autoRestoreContext._12_4_ = ChakraRTInterface::JsCreateContext(this->m_runtime,&this->m_context);
  if (autoRestoreContext._12_4_ == JsNoError) {
    autoRestoreContext._8_4_ = ChakraRTInterface::JsAddRef(this->m_context,(uint *)0x0);
    if (autoRestoreContext._8_4_ == JsNoError) {
      AutoRestoreContext::AutoRestoreContext((AutoRestoreContext *)&globalFunc,this->m_context);
      scriptSource = (JsValueRef)0x0;
      local_44 = ChakraRTInterface::JsCreateExternalArrayBuffer
                           ("//-------------------------------------------------------------------------------------------------------\n// Copyright (C) Microsoft. All rights reserved.\n// Copyright (c) 2021 ChakraCore Project Contributors. All rights reserved.\n// Licensed under the MIT license. See LICENSE.txt file in the project root for full license information.\n//-------------------------------------------------------------------------------------------------------\n\nvar TRACE_NONE = 0x0000;\nvar TRACE_COMMANDS = 0x001;\nvar TRACE_DIAG_OUTPUT = 0x002;\nvar TRACE_INTERNAL_FUNCTIONS = 0x004;\nvar TRACE_DEBUG_EVENTS = 0x008;\nvar TRACE_ALL = TRACE_COMMANDS | TRACE_DIAG_OUTPUT | TRACE_INTERNAL_FUNCTIONS | TRACE_DEBUG_EVENTS;\n\n// Have all JsDiag* functions installed on it by Debugger.cpp\nvar hostDebugObject = {};\n\nvar controllerObj = (function () {\n    var _commandList = [];\n    var _commandCompletions = [];\n    var _wasResumed = false;\n    var _currentStackFrameIndex = 0;\n    var _trace = TRACE_NONE;\n    var _eventLog = [];\n    var _baseline = undefined;\n    var _exceptionCommands = undefined;\n    var _onasyncbreakCommands = undefined;\n    var _inspectMaxStringLength = 16;\n\n    function internalPrint(str) {\n        WScript.Echo(str);\n    }\n\n    function isTracing(traceFlag) {\n        return _trace & traceFlag;\n    }\n\n    function internalTrace(traceFlag, ...varArgs) {\n        if (isTracing(traceFlag)) {\n            var str = \"\";\n            varArgs.map(function (element) {\n                str += (typeof element != \"string\") ? JSON.stringify(element, undefined, \"  \") : element;\n            });\n            internalPrint(str);\n        }\n    }\n\n    function printError(str) {\n        internalPrint(\"Error: \" + str);\n    }\n\n    function callHostFunction(fn) {\n        var result = fn.apply(undefined, [].slice.call(arguments, 1));\n        var obj = {};\n        obj[fn.name] = result;\n        internalTrace(TRACE_DIAG_OUTPUT, obj);\n        return result;\n    }\n\n    filterLog = (function () {\n        var parentFilter = { \"this\": 1, \"locals\": 1, \"globals\": 1 };\n ..." /* TRUNCATED STRING LITERAL */
                            ,0x9d77,(JsFinalizeCallback)0x0,(void *)0x0,&stack0xffffffffffffffc0);
      if (local_44 == JsNoError) {
        ChakraRTInterface::JsCreateString("DbgController.js",0x10,&stack0xffffffffffffffa0);
        undefinedValue._4_4_ =
             ChakraRTInterface::JsParse
                       (pvStack_40,0xffffffffffffffff,pvStack_60,JsParseScriptAttributeLibraryCode,
                        &scriptSource);
        if (undefinedValue._4_4_ == JsNoError) {
          args[0]._4_4_ = ChakraRTInterface::JsGetUndefinedValue(&stack0xffffffffffffff90);
          if (args[0]._4_4_ == JsNoError) {
            result = pvStack_70;
            pvStack_88 = (JsValueRef)0x0;
            globalObj._4_4_ =
                 ChakraRTInterface::JsCallFunction(scriptSource,&result,1,&stack0xffffffffffffff78);
            if (globalObj._4_4_ == JsNoError) {
              pvStack_98 = (JsValueRef)0x0;
              hostDebugObjectPropId._4_4_ =
                   ChakraRTInterface::JsGetGlobalObject(&stack0xffffffffffffff68);
              if (hostDebugObjectPropId._4_4_ == JsNoError) {
                hostDebugObject._4_4_ =
                     CreatePropertyIdFromString("hostDebugObject",&stack0xffffffffffffff58);
                if (hostDebugObject._4_4_ == JsNoError) {
                  JVar3 = ChakraRTInterface::JsGetProperty
                                    (pvStack_98,pvStack_a8,&stack0xffffffffffffff48);
                  if (JVar3 == JsNoError) {
                    InstallDebugCallbacks(this,pvStack_b8);
                    bVar2 = WScriptJsrt::Initialize();
                    if (bVar2) {
                      if ((HostConfigFlags::flags.dbgbaselineIsEnabled & 1U) != 0) {
                        SetBaseline(this);
                      }
                      if ((HostConfigFlags::flags.InspectMaxStringLengthIsEnabled & 1U) != 0) {
                        SetInspectMaxStringLength(this);
                      }
                      this_local._7_1_ = true;
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    pPVar4 = PAL_get_stderr(0);
                    pWVar5 = Helpers::JsErrorCodeToString(JVar3);
                    PAL_fwprintf(pPVar4,
                                 L"ERROR: ChakraRTInterface::JsGetProperty(globalObj, hostDebugObjectPropId, &hostDebugObject) failed. JsErrorCode=0x%x (%s)\n"
                                 ,(ulong)JVar3,pWVar5);
                    pPVar4 = PAL_get_stderr(0);
                    PAL_fflush(pPVar4);
                    this_local._7_1_ = false;
                  }
                }
                else {
                  pPVar4 = PAL_get_stderr(0);
                  JVar3 = hostDebugObject._4_4_;
                  pWVar5 = Helpers::JsErrorCodeToString(hostDebugObject._4_4_);
                  PAL_fwprintf(pPVar4,
                               L"ERROR: CreatePropertyIdFromString(\"hostDebugObject\", &hostDebugObjectPropId) failed. JsErrorCode=0x%x (%s)\n"
                               ,(ulong)JVar3,pWVar5);
                  pPVar4 = PAL_get_stderr(0);
                  PAL_fflush(pPVar4);
                  this_local._7_1_ = false;
                }
              }
              else {
                pPVar4 = PAL_get_stderr(0);
                JVar3 = hostDebugObjectPropId._4_4_;
                pWVar5 = Helpers::JsErrorCodeToString(hostDebugObjectPropId._4_4_);
                PAL_fwprintf(pPVar4,
                             L"ERROR: ChakraRTInterface::JsGetGlobalObject(&globalObj) failed. JsErrorCode=0x%x (%s)\n"
                             ,(ulong)JVar3,pWVar5);
                pPVar4 = PAL_get_stderr(0);
                PAL_fflush(pPVar4);
                this_local._7_1_ = false;
              }
            }
            else {
              pPVar4 = PAL_get_stderr(0);
              JVar3 = globalObj._4_4_;
              pWVar5 = Helpers::JsErrorCodeToString(globalObj._4_4_);
              PAL_fwprintf(pPVar4,
                           L"ERROR: ChakraRTInterface::JsCallFunction(globalFunc, args, _countof(args), &result) failed. JsErrorCode=0x%x (%s)\n"
                           ,(ulong)JVar3,pWVar5);
              pPVar4 = PAL_get_stderr(0);
              PAL_fflush(pPVar4);
              this_local._7_1_ = false;
            }
          }
          else {
            pPVar4 = PAL_get_stderr(0);
            JVar3 = args[0]._4_4_;
            pWVar5 = Helpers::JsErrorCodeToString(args[0]._4_4_);
            PAL_fwprintf(pPVar4,
                         L"ERROR: ChakraRTInterface::JsGetUndefinedValue(&undefinedValue) failed. JsErrorCode=0x%x (%s)\n"
                         ,(ulong)JVar3,pWVar5);
            pPVar4 = PAL_get_stderr(0);
            PAL_fflush(pPVar4);
            this_local._7_1_ = false;
          }
        }
        else {
          pPVar4 = PAL_get_stderr(0);
          JVar3 = undefinedValue._4_4_;
          pWVar5 = Helpers::JsErrorCodeToString(undefinedValue._4_4_);
          PAL_fwprintf(pPVar4,
                       L"ERROR: ChakraRTInterface::JsParse(scriptSource, JS_SOURCE_CONTEXT_NONE, fname, JsParseScriptAttributeLibraryCode, &globalFunc) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar3,pWVar5);
          pPVar4 = PAL_get_stderr(0);
          PAL_fflush(pPVar4);
          this_local._7_1_ = false;
        }
      }
      else {
        pPVar4 = PAL_get_stderr(0);
        JVar3 = local_44;
        pWVar5 = Helpers::JsErrorCodeToString(local_44);
        PAL_fwprintf(pPVar4,
                     L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer( (void*)controllerScript, (unsigned int)strlen(controllerScript), nullptr, nullptr, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
                     ,(ulong)JVar3,pWVar5);
        pPVar4 = PAL_get_stderr(0);
        PAL_fflush(pPVar4);
        this_local._7_1_ = false;
      }
      fname._0_4_ = 1;
      AutoRestoreContext::~AutoRestoreContext((AutoRestoreContext *)&globalFunc);
    }
    else {
      pPVar4 = PAL_get_stderr(0);
      uVar1 = autoRestoreContext._8_4_;
      pWVar5 = Helpers::JsErrorCodeToString(autoRestoreContext._8_4_);
      PAL_fwprintf(pPVar4,
                   L"ERROR: ChakraRTInterface::JsAddRef(this->m_context, nullptr) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)(uint)uVar1,pWVar5);
      pPVar4 = PAL_get_stderr(0);
      PAL_fflush(pPVar4);
      this_local._7_1_ = false;
    }
  }
  else {
    pPVar4 = PAL_get_stderr(0);
    uVar1 = autoRestoreContext._12_4_;
    pWVar5 = Helpers::JsErrorCodeToString(autoRestoreContext._12_4_);
    PAL_fwprintf(pPVar4,
                 L"ERROR: ChakraRTInterface::JsCreateContext(this->m_runtime, &this->m_context) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)(uint)uVar1,pWVar5);
    pPVar4 = PAL_get_stderr(0);
    PAL_fflush(pPVar4);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Debugger::Initialize()
{
    // Create a new context and run dbgcontroller.js in that context
    // setup dbgcontroller.js callbacks

    Assert(this->m_context == JS_INVALID_REFERENCE);
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCreateContext(this->m_runtime, &this->m_context));
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsAddRef(this->m_context, nullptr)); // Pin context

    AutoRestoreContext autoRestoreContext(this->m_context);

    JsValueRef globalFunc = JS_INVALID_REFERENCE;
    JsValueRef scriptSource;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCreateExternalArrayBuffer(
        (void*)controllerScript, (unsigned int)strlen(controllerScript),
        nullptr, nullptr, &scriptSource));
    JsValueRef fname;
    ChakraRTInterface::JsCreateString(
        "DbgController.js", strlen("DbgController.js"), &fname);
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsParse(scriptSource,
        JS_SOURCE_CONTEXT_NONE, fname, JsParseScriptAttributeLibraryCode,
        &globalFunc));

    JsValueRef undefinedValue;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetUndefinedValue(&undefinedValue));

    JsValueRef args[] = { undefinedValue };
    JsValueRef result = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCallFunction(globalFunc, args, _countof(args), &result));

    JsValueRef globalObj = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetGlobalObject(&globalObj));

    JsPropertyIdRef hostDebugObjectPropId;
    IfJsrtErrorFailLogAndRetFalse(CreatePropertyIdFromString("hostDebugObject", &hostDebugObjectPropId));

    JsPropertyIdRef hostDebugObject;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetProperty(globalObj, hostDebugObjectPropId, &hostDebugObject));

    this->InstallDebugCallbacks(hostDebugObject);

    if (!WScriptJsrt::Initialize())
    {
        return false;
    }

    if (HostConfigFlags::flags.dbgbaselineIsEnabled)
    {
        this->SetBaseline();
    }

    if (HostConfigFlags::flags.InspectMaxStringLengthIsEnabled)
    {
        this->SetInspectMaxStringLength();
    }

    return true;
}